

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LoopFusionPass::Process(LoopFusionPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *this_00;
  Module *this_01;
  reference function;
  bool bVar3;
  Function *f;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  Module *module;
  bool modified;
  LoopFusionPass *this_local;
  
  bVar3 = false;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::module(this_00);
  join_0x00000010_0x00000000_ = Module::begin(this_01);
  _f = Module::end(this_01);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::Function,_false> *)&f);
    if (!bVar1) break;
    function = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar1 = ProcessFunction(this,function);
    bVar3 = bVar3 || bVar1;
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if (bVar3) {
    SVar2 = SuccessWithChange;
  }
  return SVar2;
}

Assistant:

Pass::Status LoopFusionPass::Process() {
  bool modified = false;
  Module* module = context()->module();

  // Process each function in the module
  for (Function& f : *module) {
    modified |= ProcessFunction(&f);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}